

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

uint64_t __thiscall
r_comp::Decompiler::decompile
          (Decompiler *this,Image *image,ostringstream *stream,uint64_t time_offset,
          bool ignore_named_objects)

{
  uint64_t uVar1;
  uint16_t object_index;
  ushort uVar2;
  
  this->ignore_named_objects = ignore_named_objects;
  uVar1 = decompile_references(this,image);
  if ((image->code_segment).objects.m_vector.
      super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (image->code_segment).objects.m_vector.
      super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    object_index = 0;
    do {
      decompile_object(this,object_index,stream,time_offset);
      uVar2 = object_index + 1;
      object_index = object_index + 1;
    } while ((ulong)uVar2 <
             (ulong)((long)(image->code_segment).objects.m_vector.
                           super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(image->code_segment).objects.m_vector.
                           super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return uVar1;
}

Assistant:

uint64_t Decompiler::decompile(r_comp::Image *image, std::ostringstream *stream, uint64_t time_offset, bool ignore_named_objects)
{
    this->ignore_named_objects = ignore_named_objects;
    uint64_t object_count = decompile_references(image);

    for (uint16_t i = 0; i < image->code_segment.objects.size(); ++i) {
        decompile_object(i, stream, time_offset);
    }

    return object_count;
}